

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SinglePoolStrategy.cpp
# Opt level: O2

void __thiscall
xmrig::SinglePoolStrategy::SinglePoolStrategy
          (SinglePoolStrategy *this,Pool *pool,int retryPause,int retries,
          IStrategyListener *listener,bool quiet)

{
  IClient *pIVar1;
  undefined3 in_register_00000089;
  
  (this->super_IStrategy)._vptr_IStrategy = (_func_int **)&PTR__SinglePoolStrategy_001bb438;
  (this->super_IClientListener)._vptr_IClientListener = (_func_int **)&DAT_001bb4b8;
  this->m_active = false;
  this->m_listener = listener;
  pIVar1 = Pool::createClient(pool,0,&this->super_IClientListener);
  this->m_client = pIVar1;
  (*pIVar1->_vptr_IClient[0x17])(pIVar1,(ulong)(uint)retries);
  (*this->m_client->_vptr_IClient[0x18])(this->m_client,(long)(retryPause * 1000));
  (*this->m_client->_vptr_IClient[0x16])(this->m_client,(ulong)CONCAT31(in_register_00000089,quiet))
  ;
  return;
}

Assistant:

xmrig::SinglePoolStrategy::SinglePoolStrategy(const Pool &pool, int retryPause, int retries, IStrategyListener *listener, bool quiet) :
    m_active(false),
    m_listener(listener)
{
    m_client = pool.createClient(0, this);
    m_client->setRetries(retries);
    m_client->setRetryPause(retryPause * 1000);
    m_client->setQuiet(quiet);
}